

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  ulong uVar5;
  int iVar6;
  
  iVar1 = this->exponent_;
  uVar2 = other->exponent_;
  iVar6 = iVar1 - uVar2;
  if (iVar6 != 0 && (int)uVar2 <= iVar1) {
    uVar3 = this->used_digits_;
    if (0x80 < (int)(uVar3 + iVar6)) {
      abort();
    }
    if (0 < (int)uVar3) {
      puVar4 = (this->bigits_).start_;
      uVar5 = (ulong)uVar3 + 1;
      do {
        puVar4[(long)iVar6 + (uVar5 - 2)] = puVar4[uVar5 - 2];
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
    if (0 < iVar6) {
      memset((this->bigits_).start_,0,(ulong)(iVar1 + ~uVar2) * 4 + 4);
    }
    this->used_digits_ = this->used_digits_ + iVar6;
    this->exponent_ = this->exponent_ - iVar6;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" digit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    int zero_digits = exponent_ - other.exponent_;
    EnsureCapacity(used_digits_ + zero_digits);
    for (int i = used_digits_ - 1; i >= 0; --i) {
      bigits_[i + zero_digits] = bigits_[i];
    }
    for (int i = 0; i < zero_digits; ++i) {
      bigits_[i] = 0;
    }
    used_digits_ += zero_digits;
    exponent_ -= zero_digits;
    ASSERT(used_digits_ >= 0);
    ASSERT(exponent_ >= 0);
  }
}